

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::anon_unknown_0::DeleteSubstring(CordRepSubstring *substring)

{
  bool bVar1;
  CordRep *pCVar2;
  CordRepExternal *rep_00;
  CordRep *rep;
  CordRepSubstring *substring_local;
  
  pCVar2 = substring->child;
  bVar1 = RefcountAndFlags::Decrement(&pCVar2->refcount);
  if (!bVar1) {
    if (pCVar2->tag < 6) {
      if (pCVar2->tag != '\x05') {
        __assert_fail("rep->tag == EXTERNAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0xcf,
                      "void absl::cord_internal::(anonymous namespace)::DeleteSubstring(CordRepSubstring *)"
                     );
      }
      rep_00 = CordRep::external(pCVar2);
      CordRepExternal::Delete(&rep_00->super_CordRep);
    }
    else {
      pCVar2 = &CordRep::flat(pCVar2)->super_CordRep;
      CordRepFlat::Delete(pCVar2);
    }
  }
  if (substring != (CordRepSubstring *)0x0) {
    operator_delete(substring,0x20);
  }
  return;
}

Assistant:

void DeleteSubstring(CordRepSubstring* substring) {
  CordRep* rep = substring->child;
  if (!rep->refcount.Decrement()) {
    if (rep->tag >= FLAT) {
      CordRepFlat::Delete(rep->flat());
    } else {
      assert(rep->tag == EXTERNAL);
      CordRepExternal::Delete(rep->external());
    }
  }
  delete substring;
}